

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::Demangle(char *mangled,char *out,size_t out_size)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  ReturnAddress RVar13;
  char cVar14;
  long lVar15;
  int iVar16;
  State state;
  int iStack_1e4;
  RustSymbolParser RStack_1e0;
  
  if ((*mangled != '_') || (mangled[1] != 'R')) {
    RStack_1e0.out_ = (char *)0x3422fe;
    bVar7 = ParseMangledName((State *)&stack0xffffffffffffffd0);
    if ((bVar7) && (*mangled != '\0')) {
      lVar15 = 0;
      do {
        if (mangled[lVar15] != '.') {
          if (mangled[lVar15] == '\0') {
            return false;
          }
          break;
        }
        bVar8 = mangled[lVar15 + 1];
        bVar7 = (byte)((bVar8 & 0xdf) + 0xbf) < 0x1a;
        if (bVar8 == 0x5f || bVar7) {
          lVar15 = lVar15 + 1;
          do {
            do {
              bVar1 = mangled[lVar15 + 1];
              lVar15 = lVar15 + 1;
            } while (bVar1 == 0x5f);
          } while ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
          bVar3 = true;
          if (bVar1 == 0x2e) goto LAB_00342389;
        }
        else {
LAB_00342389:
          bVar3 = bVar8 == 0x5f || bVar7;
          if ((byte)(mangled[lVar15 + 1] - 0x30U) < 10) {
            lVar15 = lVar15 + 1;
            do {
              lVar10 = lVar15 + 1;
              lVar15 = lVar15 + 1;
            } while ((byte)(mangled[lVar10] - 0x30U) < 10);
            bVar3 = true;
          }
        }
      } while (bVar3);
      if (*mangled == '@') {
        RStack_1e0.out_ = (char *)0x3423d2;
        MaybeAppend((State *)&stack0xffffffffffffffd0,mangled);
      }
    }
    return false;
  }
  memset(&RStack_1e0,0,400);
  RStack_1e0.encoding_ = mangled;
  RStack_1e0.out_ = out;
  RStack_1e0.out_end_ = out + out_size;
  if (out_size != 0) {
    *out = '\0';
  }
  if (*mangled == '_') {
    iVar16 = 0;
    bVar8 = 0;
    if (mangled[1] == 'R') {
      RStack_1e0.recursion_depth_ = 1;
      RStack_1e0.recursion_stack_[0] = kInstantiatingCrate;
      RStack_1e0.pos_ = 2;
LAB_003464d0:
      lVar15 = (long)RStack_1e0.pos_ + 1;
      uVar9 = (uint)lVar15;
      bVar1 = RStack_1e0.encoding_[RStack_1e0.pos_];
      bVar8 = 0;
      if (bVar1 < 0x4d) {
        if (bVar1 == 0x42) {
          RStack_1e0.pos_ = uVar9;
          bVar7 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e0);
          if (!bVar7) goto LAB_0034782c;
          if (RStack_1e0.silence_depth_ != 0) goto switchD_00346b17_caseD_1c;
          lVar15 = (long)RStack_1e0.recursion_depth_;
          if (lVar15 == 0x100) goto LAB_0034782c;
          RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
          RStack_1e0.recursion_stack_[lVar15] = kPathBackrefEnding;
        }
        else {
          if (bVar1 == 0x43) {
            bVar8 = 0;
            RStack_1e0.pos_ = uVar9;
            bVar7 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&RStack_1e0,'\0');
            if (bVar7) goto LAB_00346ad7;
            goto LAB_0034782f;
          }
          if (bVar1 != 0x49) goto LAB_0034782f;
          lVar15 = (long)RStack_1e0.recursion_depth_;
          if (lVar15 == 0x100) goto LAB_0034782c;
          RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
          RStack_1e0.pos_ = uVar9;
          RStack_1e0.recursion_stack_[lVar15] = kBeginGenericArgList;
        }
      }
      else {
        if (bVar1 < 0x58) {
          if (bVar1 != 0x4d) {
            if (bVar1 != 0x4e) goto LAB_0034782f;
            RStack_1e0.pos_ = RStack_1e0.pos_ + 2;
            if (0x19 < (byte)(RStack_1e0.encoding_[lVar15] + 0xbfU)) {
              if (((byte)(RStack_1e0.encoding_[lVar15] + 0x9fU) < 0x1a) &&
                 (lVar15 = (long)RStack_1e0.recursion_depth_, lVar15 != 0x100)) {
                RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
                RStack_1e0.recursion_stack_[lVar15] = kIdentifierInLowercaseNamespace;
                goto switchD_00346657_caseD_43;
              }
              goto LAB_0034782c;
            }
            lVar10 = (long)RStack_1e0.namespace_depth_;
            if (lVar10 == 0x40) goto LAB_0034782c;
            RStack_1e0.namespace_depth_ = RStack_1e0.namespace_depth_ + 1;
            RStack_1e0.namespace_stack_[lVar10] = RStack_1e0.encoding_[lVar15];
            lVar15 = (long)RStack_1e0.recursion_depth_;
            if (lVar15 == 0x100) goto LAB_0034782c;
            RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
            RStack_1e0.recursion_stack_[lVar15] = kIdentifierInUppercaseNamespace;
            goto switchD_00346657_caseD_43;
          }
          if (RStack_1e0.silence_depth_ < 1) {
            if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 2) goto LAB_0034782c;
            RStack_1e0.out_[0] = '<';
            RStack_1e0.out_[1] = '\0';
            RStack_1e0.out_ = RStack_1e0.out_ + 1;
          }
          RVar13 = kInherentImplType;
        }
        else {
          if (bVar1 != 0x58) {
            if (bVar1 != 0x59) goto LAB_0034782f;
            if (RStack_1e0.silence_depth_ < 1) {
              if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 2) goto LAB_0034782c;
              RStack_1e0.out_[0] = '<';
              RStack_1e0.out_[1] = '\0';
              RStack_1e0.out_ = RStack_1e0.out_ + 1;
            }
            lVar15 = (long)RStack_1e0.recursion_depth_;
            if (lVar15 != 0x100) {
              RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
              RStack_1e0.pos_ = uVar9;
              RStack_1e0.recursion_stack_[lVar15] = kTraitDefinitionInfix;
              uVar9 = RStack_1e0.pos_;
LAB_00346616:
              RStack_1e0.pos_ = uVar9;
              lVar15 = (long)RStack_1e0.pos_;
              if ((byte)(RStack_1e0.encoding_[lVar15] + 0x9fU) < 0x1a) {
                RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                bVar8 = RStack_1e0.encoding_[lVar15] + 0x9f;
                if ((bVar8 < 0x1a) && ((0x3bcfbbfU >> (bVar8 & 0x1f) & 1) != 0)) {
                  if (0 < RStack_1e0.silence_depth_) goto LAB_00346ad7;
                  pcVar2 = (&PTR_anon_var_dwarf_d779f1_0056f5c0)[bVar8];
                  sVar11 = strlen(pcVar2);
                  pcVar6 = RStack_1e0.out_;
                  if (sVar11 + 1 <= (ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_)) {
                    memcpy(RStack_1e0.out_,pcVar2,sVar11 + 1);
                    RStack_1e0.out_ = pcVar6 + sVar11;
                    goto LAB_00346ad7;
                  }
                }
                goto LAB_0034782c;
              }
              switch(RStack_1e0.encoding_[lVar15]) {
              case 'A':
                RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 2)
                  goto LAB_0034782c;
                  RStack_1e0.out_[0] = '[';
                  RStack_1e0.out_[1] = '\0';
                  RStack_1e0.out_ = RStack_1e0.out_ + 1;
                }
                RVar13 = kArraySize;
                break;
              case 'B':
                RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                bVar7 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e0);
                if (!bVar7) goto LAB_0034782c;
                if (RStack_1e0.silence_depth_ != 0) {
switchD_00346b17_caseD_1c:
                  lVar15 = (long)RStack_1e0.position_depth_;
                  RStack_1e0.position_depth_ = RStack_1e0.position_depth_ + -1;
                  RStack_1e0.pos_ = RStack_1e0.position_stack_[lVar15 + -1];
LAB_00346ad7:
                  bVar8 = 0;
                  if ((iVar16 < 0x1ffff) &&
                     (uVar9 = RStack_1e0.recursion_depth_, bVar8 = 0,
                     0 < RStack_1e0.recursion_depth_)) {
                    do {
                      pcVar2 = RStack_1e0.out_;
                      iVar5 = RStack_1e0.silence_depth_;
                      iVar16 = iVar16 + 1;
                      RStack_1e0.recursion_depth_ = uVar9 - 1;
                      switch(RStack_1e0.recursion_stack_[(uint)RStack_1e0.recursion_depth_]) {
                      case kInstantiatingCrate:
                        if (0x19 < (byte)((RStack_1e0.encoding_[RStack_1e0.pos_] & 0xdfU) + 0xbf))
                        goto LAB_0034780c;
                        RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + 1;
                        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                        uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                        RStack_1e0.recursion_depth_ = uVar9;
                        RStack_1e0.recursion_stack_[uVar12] = kVendorSpecificSuffix;
                        goto switchD_00346657_caseD_43;
                      case kVendorSpecificSuffix:
LAB_0034780c:
                        if (0x2e < (byte)RStack_1e0.encoding_[RStack_1e0.pos_]) goto LAB_0034782c;
                        bVar8 = (byte)(0x401000000001 >>
                                      (RStack_1e0.encoding_[RStack_1e0.pos_] & 0x3fU));
                        goto LAB_0034782f;
                      case kIdentifierInUppercaseNamespace:
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 3)
                          goto LAB_0034782c;
                          RStack_1e0.out_[2] = '\0';
                          RStack_1e0.out_[0] = ':';
                          RStack_1e0.out_[1] = ':';
                          RStack_1e0.out_ = RStack_1e0.out_ + 2;
                        }
                        lVar15 = (long)RStack_1e0.namespace_depth_;
                        RStack_1e0.namespace_depth_ = RStack_1e0.namespace_depth_ + -1;
                        bVar7 = anon_unknown_0::RustSymbolParser::ParseIdentifier
                                          (&RStack_1e0,RStack_1e0.namespace_stack_[lVar15 + -1]);
                        goto LAB_00347028;
                      case kIdentifierInLowercaseNamespace:
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 3)
                          goto LAB_0034782c;
                          RStack_1e0.out_[2] = '\0';
                          RStack_1e0.out_[0] = ':';
                          RStack_1e0.out_[1] = ':';
                          RStack_1e0.out_ = RStack_1e0.out_ + 2;
                        }
                        bVar7 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&RStack_1e0,'\0');
LAB_00347028:
                        bVar8 = 0;
                        if ((bVar7 != false) && (iVar16 != 0x1ffff)) goto LAB_00347254;
                        goto LAB_0034782f;
                      case kInherentImplType:
                        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                        uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                        RStack_1e0.recursion_depth_ = uVar9;
                        RStack_1e0.recursion_stack_[uVar12] = kInherentImplEnding;
                        uVar9 = RStack_1e0.pos_;
                        goto LAB_00346616;
                      case kInherentImplEnding:
                      case kTraitImplEnding:
                      case kTraitDefinitionEnding:
                        if (0 < RStack_1e0.silence_depth_) break;
                        if (1 < (ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_)) {
                          RStack_1e0.out_[0] = '>';
                          RStack_1e0.out_[1] = '\0';
                          goto LAB_00347240;
                        }
                        goto LAB_0034782c;
                      case kTraitImplType:
                        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                        uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                        RStack_1e0.recursion_depth_ = uVar9;
                        RStack_1e0.recursion_stack_[uVar12] = kTraitImplInfix;
                        uVar9 = RStack_1e0.pos_;
                        goto LAB_00346616;
                      case kTraitImplInfix:
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 5)
                          goto LAB_0034782c;
                          builtin_strncpy(RStack_1e0.out_," as ",5);
                          RStack_1e0.out_ = RStack_1e0.out_ + 4;
                        }
                        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                        uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                        RStack_1e0.recursion_depth_ = uVar9;
                        RStack_1e0.recursion_stack_[uVar12] = kTraitImplEnding;
                        goto switchD_00346657_caseD_43;
                      case kImplPathEnding:
                      case kFinishFn:
                        goto switchD_00346b17_caseD_9;
                      case kTraitDefinitionInfix:
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 5)
                          goto LAB_0034782c;
                          builtin_strncpy(RStack_1e0.out_," as ",5);
                          RStack_1e0.out_ = RStack_1e0.out_ + 4;
                        }
                        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                        uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                        RStack_1e0.recursion_depth_ = uVar9;
                        RStack_1e0.recursion_stack_[uVar12] = kTraitDefinitionEnding;
                        goto switchD_00346657_caseD_43;
                      case kArraySize:
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 3)
                          goto LAB_0034782c;
                          RStack_1e0.out_[2] = '\0';
                          RStack_1e0.out_[0] = ';';
                          RStack_1e0.out_[1] = ' ';
                          RStack_1e0.out_ = RStack_1e0.out_ + 2;
                        }
                        if (RStack_1e0.recursion_depth_ != 0x100) {
                          uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                          RStack_1e0.recursion_depth_ = uVar9;
                          RStack_1e0.recursion_stack_[uVar12] = kFinishArray;
                          goto LAB_00347179;
                        }
                        goto LAB_0034782c;
                      case kFinishArray:
                      case kSliceEnding:
                        if (RStack_1e0.silence_depth_ < 1) {
                          if (1 < (ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_)) {
                            RStack_1e0.out_[0] = ']';
                            RStack_1e0.out_[1] = '\0';
                            goto LAB_00347240;
                          }
                          goto LAB_0034782c;
                        }
                        break;
                      case kAfterFirstTupleElement:
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] != 'E') {
                          if (RStack_1e0.silence_depth_ < 1) {
                            if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 3)
                            goto LAB_0034782c;
                            RStack_1e0.out_[2] = '\0';
                            RStack_1e0.out_[0] = ',';
                            RStack_1e0.out_[1] = ' ';
                            RStack_1e0.out_ = RStack_1e0.out_ + 2;
                          }
                          if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                          uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                          RStack_1e0.recursion_depth_ = uVar9;
                          RStack_1e0.recursion_stack_[uVar12] = kAfterSecondTupleElement;
                          uVar9 = RStack_1e0.pos_;
                          goto LAB_00346616;
                        }
                        RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 3)
                          goto LAB_0034782c;
                          RStack_1e0.out_[2] = '\0';
                          RStack_1e0.out_[0] = ',';
                          RStack_1e0.out_[1] = ')';
                          RStack_1e0.out_ = RStack_1e0.out_ + 2;
                        }
                        break;
                      case kAfterSecondTupleElement:
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'E') {
                          RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                          goto LAB_00346ec5;
                        }
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 3)
                          goto LAB_0034782c;
                          RStack_1e0.out_[2] = '\0';
                          RStack_1e0.out_[0] = ',';
                          RStack_1e0.out_[1] = ' ';
                          RStack_1e0.out_ = RStack_1e0.out_ + 2;
                        }
                        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                        uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                        RStack_1e0.recursion_depth_ = uVar9;
                        RStack_1e0.recursion_stack_[uVar12] = kAfterThirdTupleElement;
                        uVar9 = RStack_1e0.pos_;
                        goto LAB_00346616;
                      case kAfterThirdTupleElement:
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] != 'E') {
                          if (RStack_1e0.silence_depth_ < 1) {
                            if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 7)
                            goto LAB_0034782c;
                            builtin_strncpy(RStack_1e0.out_,", ...)",7);
                            RStack_1e0.out_ = RStack_1e0.out_ + 6;
                          }
                          RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + 1;
                          goto LAB_00347091;
                        }
                        RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
LAB_00346ec5:
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 2)
                          goto LAB_0034782c;
                          RStack_1e0.out_[0] = ')';
                          RStack_1e0.out_[1] = '\0';
LAB_00347240:
                          RStack_1e0.out_ = RStack_1e0.out_ + 1;
                        }
                        break;
                      case kAfterSubsequentTupleElement:
LAB_00347091:
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'E') {
                          RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                          goto switchD_00346b17_caseD_9;
                        }
                        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                        uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                        RStack_1e0.recursion_depth_ = uVar9;
                        RStack_1e0.recursion_stack_[uVar12] = kAfterSubsequentTupleElement;
                        uVar9 = RStack_1e0.pos_;
                        goto LAB_00346616;
                      case kContinueParameterList:
                        goto switchD_00346b17_caseD_13;
                      case kBeginAutoTraits:
                      case kContinueAutoTraits:
                        goto switchD_00346b17_caseD_15;
                      case kContinueDynTrait:
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'p') {
                          if (RStack_1e0.silence_depth_ < 1) {
                            if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 3)
                            goto LAB_0034782c;
                            RStack_1e0.out_[2] = '\0';
                            RStack_1e0.out_[0] = '<';
                            RStack_1e0.out_[1] = '>';
                            RStack_1e0.out_ = RStack_1e0.out_ + 2;
                          }
                          RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + 1;
                          goto LAB_00346f5c;
                        }
                        break;
                      case kContinueAssocBinding:
LAB_00346f5c:
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'p') {
                          RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                          bVar8 = 0;
                          bVar7 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                            (&RStack_1e0,'\0',0);
                          if (!bVar7) goto LAB_0034782f;
                          lVar15 = (long)RStack_1e0.recursion_depth_;
                          if (lVar15 == 0x100) goto LAB_0034782c;
                          RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
                          RStack_1e0.recursion_stack_[lVar15] = kContinueAssocBinding;
                          uVar9 = RStack_1e0.pos_;
                          goto LAB_00346616;
                        }
switchD_00346b17_caseD_9:
                        RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + -1;
                        break;
                      case kConstData:
                        RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + -1;
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'n') {
                          RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                          bVar7 = true;
                          if (iVar5 < 2) {
                            if (1 < (long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) {
                              RStack_1e0.out_ = RStack_1e0.out_ + 1;
                              *pcVar2 = '-';
                              *RStack_1e0.out_ = '\0';
                              goto LAB_00346bf8;
                            }
                            goto LAB_0034782c;
                          }
                        }
                        else {
LAB_00346bf8:
                          bVar7 = true;
                          if (RStack_1e0.silence_depth_ < 1) {
                            if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 3)
                            goto LAB_0034782c;
                            RStack_1e0.out_[2] = '\0';
                            RStack_1e0.out_[0] = '0';
                            RStack_1e0.out_[1] = 'x';
                            RStack_1e0.out_ = RStack_1e0.out_ + 2;
                            bVar7 = false;
                          }
                        }
                        pcVar2 = RStack_1e0.out_;
                        uVar12 = (ulong)RStack_1e0.pos_;
                        cVar14 = RStack_1e0.encoding_[uVar12];
                        if (cVar14 == '0') {
                          if (!bVar7) {
                            if ((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_ < 2)
                            goto LAB_0034782c;
                            RStack_1e0.out_ = RStack_1e0.out_ + 1;
                            *pcVar2 = '0';
                            *RStack_1e0.out_ = '\0';
                          }
                          if (RStack_1e0.encoding_[(int)(RStack_1e0.pos_ + 1)] != '_')
                          goto LAB_0034782c;
                          RStack_1e0.pos_ = RStack_1e0.pos_ + 2;
                        }
                        else {
                          uVar4 = uVar12;
                          if ((byte)(cVar14 - 0x30U) < 10 || (byte)(cVar14 + 0x9fU) < 6) {
                            do {
                              pcVar2 = RStack_1e0.out_;
                              RStack_1e0.pos_ = (int)uVar12 + 1;
                              if (RStack_1e0.silence_depth_ < 1) {
                                if ((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_ < 2)
                                goto LAB_0034782c;
                                RStack_1e0.out_ = RStack_1e0.out_ + 1;
                                *pcVar2 = RStack_1e0.encoding_[uVar4];
                                *RStack_1e0.out_ = '\0';
                              }
                              uVar12 = (ulong)(uint)RStack_1e0.pos_;
                              cVar14 = RStack_1e0.encoding_[RStack_1e0.pos_];
                              uVar4 = (long)RStack_1e0.pos_;
                            } while ((byte)(cVar14 + 0x9fU) < 6 || (byte)(cVar14 - 0x30U) < 10);
                          }
                          if (cVar14 != '_') goto LAB_0034782c;
                          RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                        }
                        break;
                      case kBeginGenericArgList:
                        if (RStack_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 5)
                          goto LAB_0034782c;
                          builtin_strncpy(RStack_1e0.out_,"::<>",5);
                          RStack_1e0.out_ = RStack_1e0.out_ + 4;
                        }
                        RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + 1;
                        goto switchD_00346b17_caseD_1b;
                      case kContinueGenericArgList:
switchD_00346b17_caseD_1b:
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'E') {
                          RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                          goto switchD_00346b17_caseD_9;
                        }
                        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                        uVar12 = (ulong)(uint)RStack_1e0.recursion_depth_;
                        RStack_1e0.recursion_depth_ = uVar9;
                        RStack_1e0.recursion_stack_[uVar12] = kContinueGenericArgList;
                        if (RStack_1e0.encoding_[RStack_1e0.pos_] != 'K') {
                          uVar9 = RStack_1e0.pos_;
                          if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'L') {
                            RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                            bVar7 = anon_unknown_0::RustSymbolParser::ParseBase62Number
                                              (&RStack_1e0,&iStack_1e4);
                            goto LAB_00347028;
                          }
                          goto LAB_00346616;
                        }
                        RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
LAB_00347179:
                        uVar12 = (ulong)(uint)RStack_1e0.pos_;
                        cVar14 = RStack_1e0.encoding_[RStack_1e0.pos_];
                        while (cVar14 == 'B') {
                          RStack_1e0.pos_ = (int)uVar12 + 1;
                          bVar7 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e0);
                          if (!bVar7) goto LAB_0034782c;
                          if (RStack_1e0.silence_depth_ != 0) goto switchD_00346b17_caseD_1e;
                          lVar15 = (long)RStack_1e0.recursion_depth_;
                          if (lVar15 == 0x100) goto LAB_0034782c;
                          RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
                          RStack_1e0.recursion_stack_[lVar15] = kConstantBackrefEnding;
                          uVar12 = (ulong)RStack_1e0.pos_;
                          cVar14 = RStack_1e0.encoding_[uVar12];
                        }
                        if (cVar14 == 'p') {
                          RStack_1e0.pos_ = (int)uVar12 + 1;
                          if (0 < RStack_1e0.silence_depth_) break;
                          if (1 < (ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_)) {
                            RStack_1e0.out_[0] = '_';
                            RStack_1e0.out_[1] = '\0';
                            goto LAB_00347240;
                          }
                          goto LAB_0034782c;
                        }
                        RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + 1;
                        lVar15 = (long)RStack_1e0.recursion_depth_;
                        if (lVar15 == 0x100) goto LAB_0034782c;
                        RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
                        RStack_1e0.recursion_stack_[lVar15] = kConstData;
                        uVar9 = RStack_1e0.pos_;
                        goto LAB_00346616;
                      case kPathBackrefEnding:
                      case kTypeBackrefEnding:
                        goto switchD_00346b17_caseD_1c;
                      case kConstantBackrefEnding:
switchD_00346b17_caseD_1e:
                        lVar15 = (long)RStack_1e0.position_depth_;
                        RStack_1e0.position_depth_ = RStack_1e0.position_depth_ + -1;
                        RStack_1e0.pos_ = RStack_1e0.position_stack_[lVar15 + -1];
                      }
                      if (iVar16 == 0x1ffff) goto LAB_0034782c;
LAB_00347254:
                      uVar9 = RStack_1e0.recursion_depth_;
                      if (RStack_1e0.recursion_depth_ < 1) goto LAB_0034782c;
                    } while( true );
                  }
                  goto LAB_0034782f;
                }
                RVar13 = kTypeBackrefEnding;
                break;
              default:
                goto switchD_00346657_caseD_43;
              case 'D':
                RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 5)
                  goto LAB_0034782c;
                  builtin_strncpy(RStack_1e0.out_,"dyn ",5);
                  RStack_1e0.out_ = RStack_1e0.out_ + 4;
                }
                bVar7 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder(&RStack_1e0);
                if (!bVar7) goto LAB_0034782c;
                if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'E') goto LAB_00347462;
                RVar13 = kBeginAutoTraits;
LAB_00347581:
                if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
                lVar15 = (long)RStack_1e0.recursion_depth_;
                RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
                RStack_1e0.recursion_stack_[lVar15] = RVar13;
                lVar15 = (long)RStack_1e0.recursion_depth_;
                if (lVar15 == 0x100) goto LAB_0034782c;
                RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
                RStack_1e0.recursion_stack_[lVar15] = kContinueDynTrait;
                goto switchD_00346657_caseD_43;
              case 'F':
                RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 6)
                  goto LAB_0034782c;
                  builtin_strncpy(RStack_1e0.out_,"fn...",6);
                  RStack_1e0.out_ = RStack_1e0.out_ + 5;
                }
                RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + 1;
                bVar7 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder(&RStack_1e0);
                if (!bVar7) goto LAB_0034782c;
                lVar15 = (long)RStack_1e0.pos_;
                cVar14 = RStack_1e0.encoding_[lVar15];
                if (cVar14 == 'U') {
                  RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                  cVar14 = RStack_1e0.encoding_[lVar15 + 1];
                }
                if (cVar14 == 'K') {
                  if (RStack_1e0.encoding_[(long)RStack_1e0.pos_ + 1] == 'C') {
                    RStack_1e0.pos_ = RStack_1e0.pos_ + 2;
                  }
                  else {
                    bVar8 = 0;
                    RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                    bVar7 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                      (&RStack_1e0,'\0',0);
                    if (!bVar7) goto LAB_0034782f;
                  }
                }
switchD_00346b17_caseD_13:
                if (RStack_1e0.encoding_[RStack_1e0.pos_] == 'E') {
                  RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                  lVar15 = (long)RStack_1e0.recursion_depth_;
                  if (lVar15 == 0x100) goto LAB_0034782c;
                  RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
                  RStack_1e0.recursion_stack_[lVar15] = kFinishFn;
                  uVar9 = RStack_1e0.pos_;
                }
                else {
                  lVar15 = (long)RStack_1e0.recursion_depth_;
                  if (lVar15 == 0x100) goto LAB_0034782c;
                  RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
                  RStack_1e0.recursion_stack_[lVar15] = kContinueParameterList;
                  uVar9 = RStack_1e0.pos_;
                }
                goto LAB_00346616;
              case 'O':
                uVar9 = RStack_1e0.pos_ + 1;
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 6)
                  goto LAB_0034782c;
                  builtin_strncpy(RStack_1e0.out_,"*mut ",6);
                  RStack_1e0.out_ = RStack_1e0.out_ + 5;
                }
                goto LAB_00346616;
              case 'P':
                uVar9 = RStack_1e0.pos_ + 1;
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 8)
                  goto LAB_0034782c;
                  builtin_strncpy(RStack_1e0.out_,"*const ",8);
                  RStack_1e0.out_ = RStack_1e0.out_ + 7;
                }
                goto LAB_00346616;
              case 'Q':
                uVar9 = (uint)((long)RStack_1e0.pos_ + 1);
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 6)
                  goto LAB_0034782c;
                  builtin_strncpy(RStack_1e0.out_,"&mut ",6);
                  RStack_1e0.out_ = RStack_1e0.out_ + 5;
                }
                cVar14 = RStack_1e0.encoding_[(long)RStack_1e0.pos_ + 1];
                goto joined_r0x00346746;
              case 'R':
                uVar9 = RStack_1e0.pos_ + 1;
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 2)
                  goto LAB_0034782c;
                  RStack_1e0.out_[0] = '&';
                  RStack_1e0.out_[1] = '\0';
                  RStack_1e0.out_ = RStack_1e0.out_ + 1;
                }
                cVar14 = RStack_1e0.encoding_[(int)uVar9];
joined_r0x00346746:
                if (cVar14 == 'L') {
                  RStack_1e0.pos_ = RStack_1e0.pos_ + 2;
                  bVar7 = anon_unknown_0::RustSymbolParser::ParseBase62Number
                                    (&RStack_1e0,&iStack_1e4);
                  uVar9 = RStack_1e0.pos_;
                  if (!bVar7) goto LAB_0034782c;
                }
                goto LAB_00346616;
              case 'S':
                RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 2)
                  goto LAB_0034782c;
                  RStack_1e0.out_[0] = '[';
                  RStack_1e0.out_[1] = '\0';
                  RStack_1e0.out_ = RStack_1e0.out_ + 1;
                }
                RVar13 = kSliceEnding;
                break;
              case 'T':
                if (RStack_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 2)
                  goto LAB_0034782c;
                  RStack_1e0.out_[0] = '(';
                  RStack_1e0.out_[1] = '\0';
                  RStack_1e0.out_ = RStack_1e0.out_ + 1;
                }
                if (RStack_1e0.encoding_[(int)(RStack_1e0.pos_ + 1U)] == 'E') {
                  RStack_1e0.pos_ = RStack_1e0.pos_ + 2;
                  if (0 < RStack_1e0.silence_depth_) goto LAB_00346ad7;
                  if (1 < (ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_)) {
                    RStack_1e0.out_[0] = ')';
                    RStack_1e0.out_[1] = '\0';
                    RStack_1e0.out_ = RStack_1e0.out_ + 1;
                    goto LAB_00346ad7;
                  }
                  goto LAB_0034782c;
                }
                RVar13 = kAfterFirstTupleElement;
                RStack_1e0.pos_ = RStack_1e0.pos_ + 1U;
              }
              if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
              lVar15 = (long)RStack_1e0.recursion_depth_;
              RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
              RStack_1e0.recursion_stack_[lVar15] = RVar13;
              uVar9 = RStack_1e0.pos_;
              goto LAB_00346616;
            }
            goto LAB_0034782c;
          }
          if (RStack_1e0.silence_depth_ < 1) {
            if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 2) goto LAB_0034782c;
            RStack_1e0.out_[0] = '<';
            RStack_1e0.out_[1] = '\0';
            RStack_1e0.out_ = RStack_1e0.out_ + 1;
          }
          RVar13 = kTraitImplType;
        }
        if (RStack_1e0.recursion_depth_ == 0x100) goto LAB_0034782c;
        lVar15 = (long)RStack_1e0.recursion_depth_;
        RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
        RStack_1e0.pos_ = uVar9;
        RStack_1e0.recursion_stack_[lVar15] = RVar13;
        RStack_1e0.silence_depth_ = RStack_1e0.silence_depth_ + 1;
        bVar7 = anon_unknown_0::RustSymbolParser::ParseDisambiguator(&RStack_1e0,&iStack_1e4);
        if ((!bVar7) || (lVar15 = (long)RStack_1e0.recursion_depth_, lVar15 == 0x100))
        goto LAB_0034782c;
        RStack_1e0.recursion_depth_ = RStack_1e0.recursion_depth_ + 1;
        RStack_1e0.recursion_stack_[lVar15] = kImplPathEnding;
      }
switchD_00346657_caseD_43:
      goto LAB_003464d0;
    }
  }
  else {
LAB_0034782c:
    bVar8 = 0;
  }
LAB_0034782f:
  return (bool)(bVar8 & 1);
switchD_00346b17_caseD_15:
  if (RStack_1e0.encoding_[RStack_1e0.pos_] != 'E') {
    if (RStack_1e0.silence_depth_ < 1) {
      if ((ulong)((long)RStack_1e0.out_end_ - (long)RStack_1e0.out_) < 4) goto LAB_0034782c;
      builtin_strncpy(RStack_1e0.out_," + ",4);
      RStack_1e0.out_ = RStack_1e0.out_ + 3;
    }
    RVar13 = kContinueAutoTraits;
    goto LAB_00347581;
  }
LAB_00347462:
  RStack_1e0.pos_ = RStack_1e0.pos_ + 1;
  bVar7 = anon_unknown_0::RustSymbolParser::ParseRequiredLifetime(&RStack_1e0);
  if (!bVar7) goto LAB_0034782c;
  goto LAB_00346ad7;
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
  if (mangled[0] == '_' && mangled[1] == 'R') {
    return DemangleRustSymbolEncoding(mangled, out, out_size);
  }

  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}